

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
NodeView::get_long_reads
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,NodeView *this,
          string *datastore_name)

{
  long lVar1;
  pointer pvVar2;
  pointer puVar3;
  LongReadsDatastore *pLVar4;
  long lVar5;
  pointer puVar6;
  unsigned_long local_28;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar4 = WorkSpace::get_long_reads_datastore(this->dg->sdg->ws,datastore_name);
  lVar1 = this->id;
  lVar5 = -lVar1;
  if (0 < lVar1) {
    lVar5 = lVar1;
  }
  pvVar2 = (pLVar4->mapper).reads_in_node.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(pointer *)
            ((long)&pvVar2[lVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  for (puVar6 = pvVar2[lVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    local_28 = *puVar6;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (__return_storage_ptr__,(long *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<seqID_t> NodeView::get_long_reads(std::string datastore_name) const {
    std::vector<seqID_t> reads;
    for(auto rm:dg->sdg.ws.get_long_reads_datastore(datastore_name).mapper.reads_in_node[llabs(id)]) reads.push_back(rm);
    return reads;
}